

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSON.cc
# Opt level: O0

JSON __thiscall JSON::getDictItem(JSON *this,string *key)

{
  bool bVar1;
  element_type *this_00;
  pointer pJVar2;
  pointer ppVar3;
  key_type *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  JSON JVar5;
  _Base_ptr local_68;
  _Base_ptr local_60;
  _Self local_38;
  _Self local_30;
  const_iterator it;
  JSON_dictionary *v;
  string *key_local;
  JSON *this_local;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)key);
  if (bVar1) {
    this_00 = std::__shared_ptr_access<JSON::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<JSON::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)key);
    pJVar2 = std::unique_ptr<JSON::JSON_value,_std::default_delete<JSON::JSON_value>_>::get
                       (&this_00->value);
    if (pJVar2 == (pointer)0x0) {
      local_60 = (_Base_ptr)0x0;
    }
    else {
      local_60 = (_Base_ptr)
                 __dynamic_cast(pJVar2,&JSON_value::typeinfo,&JSON_dictionary::typeinfo,0);
    }
    local_68 = local_60;
  }
  else {
    local_68 = (_Base_ptr)0x0;
  }
  it._M_node = local_68;
  if (local_68 != (_Base_ptr)0x0) {
    local_30._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON>_>_>
         ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON>_>_>
                 *)&local_68->_M_left,in_RDX);
    local_38._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON>_>_>
         ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON>_>_>
                *)&(it._M_node)->_M_left);
    bVar1 = std::operator!=(&local_30,&local_38);
    if (bVar1) {
      ppVar3 = std::
               _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON>_>
               ::operator->(&local_30);
      JSON(this,&ppVar3->second);
      _Var4._M_pi = extraout_RDX;
      goto LAB_00127e46;
    }
  }
  JVar5 = makeNull();
  _Var4._M_pi = JVar5.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi;
LAB_00127e46:
  JVar5.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var4._M_pi;
  JVar5.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (JSON)JVar5.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

JSON
JSON::getDictItem(std::string const& key) const
{
    if (auto v = m ? dynamic_cast<JSON_dictionary const*>(m->value.get()) : nullptr) {
        if (auto it = v->members.find(key); it != v->members.end()) {
            return it->second;
        }
    }
    return makeNull();
}